

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O2

ON_Extrusion *
ON_Extrusion::Cylinder(ON_Cylinder *cylinder,bool bCapBottom,bool bCapTop,ON_Extrusion *extrusion)

{
  double dVar1;
  ON_3dPoint A;
  ON_3dPoint B;
  ON_3dVector up_00;
  bool bVar2;
  int iVar3;
  ON_Extrusion *pOVar4;
  ON_Extrusion *this;
  _func_int **pp_Var5;
  long lVar6;
  ON_Plane *pOVar7;
  ON_Arc *pOVar8;
  byte bVar9;
  ON_3dVector up;
  ON_Line path;
  ON_3dVector local_48;
  
  bVar9 = 0;
  bVar2 = ON_Cylinder::IsValid(cylinder);
  if ((!bVar2) || (bVar2 = ON_Cylinder::IsFinite(cylinder), !bVar2)) {
    return (ON_Extrusion *)0x0;
  }
  ON_Line::ON_Line(&path);
  ON_Plane::PointAt((ON_3dPoint *)&up,(ON_Plane *)cylinder,0.0,0.0,cylinder->height[0]);
  path.from.z = up.z;
  path.from.x = up.x;
  path.from.y = up.y;
  ON_Plane::PointAt((ON_3dPoint *)&up,(ON_Plane *)cylinder,0.0,0.0,cylinder->height[1]);
  path.to.z = up.z;
  path.to.x = up.x;
  path.to.y = up.y;
  bVar2 = ON_Line::IsValid(&path);
  if ((bVar2) && (dVar1 = ON_Line::Length(&path), 2.3283064365386963e-10 < dVar1)) {
    up.z = (cylinder->circle).plane.yaxis.z;
    up.x = (cylinder->circle).plane.yaxis.x;
    up.y = (cylinder->circle).plane.yaxis.y;
    bVar2 = ON_3dVector::IsValid(&up);
    if ((bVar2) && (bVar2 = ON_3dVector::IsUnitVector(&up), bVar2)) {
      ON_Line::Tangent(&local_48,&path);
      dVar1 = ON_3dVector::operator*(&up,&local_48);
      if (ABS(dVar1) <= 1.490116119385e-08) {
        pOVar4 = (ON_Extrusion *)operator_new(0xc0);
        ON_ArcCurve::ON_ArcCurve((ON_ArcCurve *)pOVar4,&cylinder->circle);
        pOVar7 = &ON_Plane::World_xy;
        pOVar8 = (ON_Arc *)&pOVar4->m_path;
        for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pOVar8->super_ON_Circle).plane.origin.x = (pOVar7->origin).x;
          pOVar7 = (ON_Plane *)((long)pOVar7 + ((ulong)bVar9 * -2 + 1) * 8);
          pOVar8 = (ON_Arc *)((long)pOVar8 + (ulong)bVar9 * -0x10 + 8);
        }
        *(undefined4 *)((pOVar4->m_path_domain).m_t + 1) = 2;
        iVar3 = (*(((ON_Curve *)&pOVar4->super_ON_Surface)->super_ON_Geometry).super_ON_Object.
                  _vptr_ON_Object[6])(pOVar4,0);
        if ((char)iVar3 == '\0') {
          pp_Var5 = (((ON_Curve *)&pOVar4->super_ON_Surface)->super_ON_Geometry).super_ON_Object.
                    _vptr_ON_Object;
        }
        else {
          if (extrusion == (ON_Extrusion *)0x0) {
            this = (ON_Extrusion *)operator_new(0xd0);
            ON_Extrusion(this);
          }
          else {
            Destroy(extrusion);
            this = extrusion;
          }
          A.y = path.from.y;
          A.x = path.from.x;
          A.z = path.from.z;
          B.y = path.to.y;
          B.x = path.to.x;
          B.z = path.to.z;
          up_00.y = up.y;
          up_00.x = up.x;
          up_00.z = up.z;
          bVar2 = SetPathAndUp(this,A,B,up_00);
          if ((((bVar2) && (bVar2 = SetOuterProfile(this,(ON_Curve *)pOVar4,false), bVar2)) &&
              (iVar3 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                         [6])(this,0), (char)iVar3 != '\0')) &&
             (iVar3 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                        [0x25])(SUB84(cylinder->height[0],0),cylinder->height[1],this,
                                (ulong)(this->m_bTransposed ^ 1)), (char)iVar3 != '\0')) {
            this->m_bCap[0] = bCapBottom;
            this->m_bCap[1] = bCapTop;
            iVar3 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])
                              (this,0);
            pOVar4 = (ON_Extrusion *)0x0;
            if ((char)iVar3 != '\0') {
              pOVar4 = this;
            }
            if (extrusion != (ON_Extrusion *)0x0 || (char)iVar3 != '\0') goto LAB_003f7f75;
          }
          else if (extrusion != (ON_Extrusion *)0x0) goto LAB_003f7f73;
          pp_Var5 = (this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object;
          pOVar4 = this;
        }
        (*pp_Var5[4])(pOVar4);
      }
    }
  }
LAB_003f7f73:
  pOVar4 = (ON_Extrusion *)0x0;
LAB_003f7f75:
  ON_Line::~ON_Line(&path);
  return pOVar4;
}

Assistant:

ON_Extrusion* ON_Extrusion::Cylinder( 
  const ON_Cylinder& cylinder, 
  bool bCapBottom,
  bool bCapTop,
  ON_Extrusion* extrusion
  )
{
  if ( !cylinder.IsValid() || !cylinder.IsFinite() )
    return 0;

  ON_Line path;
  path.from = cylinder.circle.plane.PointAt(0.0,0.0,cylinder.height[0]);
  path.to   = cylinder.circle.plane.PointAt(0.0,0.0,cylinder.height[1]);
  if ( !path.IsValid() || !(path.Length() > ON_ZERO_TOLERANCE) )
    return 0;

  ON_3dVector up = cylinder.circle.plane.yaxis;
  if (    !up.IsValid()
       || !up.IsUnitVector()
       || fabs(up*path.Tangent()) > ON_SQRT_EPSILON 
       )
    return 0;

  ON_ArcCurve* circle_curve = new ON_ArcCurve(cylinder.circle);
  circle_curve->m_arc.plane = ON_Plane::World_xy;
  circle_curve->m_dim = 2;
  if ( !circle_curve->IsValid() )
  {
    delete circle_curve;
    return 0;
  }

  ON_Extrusion* extrusion_cylinder = 0;
  if ( extrusion )
  {
    extrusion->Destroy();
    extrusion_cylinder = extrusion;
  }
  else
  {
    extrusion_cylinder = new ON_Extrusion();
  }

  if (    !extrusion_cylinder->SetPathAndUp(path.from,path.to,up)
       || !extrusion_cylinder->SetOuterProfile(circle_curve,false)
       || !extrusion_cylinder->IsValid()
       || !extrusion_cylinder->SetDomain(extrusion_cylinder->PathParameter(),cylinder.height[0],cylinder.height[1])
     )
  {
    if ( 0 == extrusion )
      delete extrusion_cylinder;
    return 0;
  }

  extrusion_cylinder->m_bCap[0] = bCapBottom ? true : false;
  extrusion_cylinder->m_bCap[1] = bCapTop    ? true : false;

  if ( !extrusion_cylinder->IsValid() )
  {
    if ( 0 == extrusion )
      delete extrusion_cylinder;
    return 0;
  }

  return extrusion_cylinder;
}